

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O3

json * __thiscall
anon_unknown.dwarf_62176::schema_ref::default_value
          (schema_ref *this,json_pointer *ptr,json *instance,error_handler *e)

{
  int iVar1;
  element_type *peVar2;
  int iVar3;
  undefined4 extraout_var;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  json *pjVar4;
  
  pjVar4 = &(this->super_schema).default_value_;
  if ((this->super_schema).default_value_.m_type != null) {
    return pjVar4;
  }
  this_00 = (this->target_).
            super___weak_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_00119194:
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    iVar3 = this_00->_M_use_count;
    do {
      if (iVar3 == 0) goto LAB_00119194;
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar5 = iVar3 == iVar1;
      if (bVar5) {
        this_00->_M_use_count = iVar3 + 1;
        iVar1 = iVar3;
      }
      iVar3 = iVar1;
      UNLOCK();
    } while (!bVar5);
    peVar2 = (this->target_).
             super___weak_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 != (element_type *)0x0 && this_00->_M_use_count != 0) {
      iVar3 = (*peVar2->_vptr_schema[4])(peVar2,ptr,instance,e);
      pjVar4 = (json *)CONCAT44(extraout_var,iVar3);
      goto LAB_001191dc;
    }
  }
  std::operator+(&local_48,"unresolved or freed schema-reference ",&this->id_);
  (*e->_vptr_error_handler[2])(e,ptr,instance,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    return pjVar4;
  }
LAB_001191dc:
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  return pjVar4;
}

Assistant:

const json &default_value(const json::json_pointer &ptr, const json &instance, error_handler &e) const override final
	{
		if (!default_value_.is_null())
			return default_value_;

		auto target = target_.lock();
		if (target)
			return target->default_value(ptr, instance, e);

		e.error(ptr, instance, "unresolved or freed schema-reference " + id_);

		return default_value_;
	}